

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

char * lj_buf_tmp(lua_State *L,MSize sz)

{
  uint64_t uVar1;
  SBuf *sb;
  MSize sz_local;
  lua_State *L_local;
  char *local_10;
  
  uVar1 = (L->glref).ptr64;
  *(lua_State **)(uVar1 + 0xe0) = L;
  if ((uint)((int)*(undefined8 *)(uVar1 + 0xd0) - (int)*(undefined8 *)(uVar1 + 0xd8)) < sz) {
    local_10 = lj_buf_need2((SBuf *)(uVar1 + 200),sz);
  }
  else {
    local_10 = *(char **)(uVar1 + 0xd8);
  }
  return local_10;
}

Assistant:

char * LJ_FASTCALL lj_buf_tmp(lua_State *L, MSize sz)
{
  SBuf *sb = &G(L)->tmpbuf;
  setsbufL(sb, L);
  return lj_buf_need(sb, sz);
}